

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_3)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  String *pSVar5;
  int num_disabled;
  int failed_test_count;
  int num_failures;
  undefined8 in_stack_ffffffffffffff18;
  int test_count;
  String *in_stack_ffffffffffffff20;
  UnitTest *in_stack_ffffffffffffff40;
  longlong *in_stack_ffffffffffffff48;
  String local_88;
  int local_78;
  uint local_74;
  String local_70;
  TimeInMillis local_60;
  undefined1 local_58 [48];
  String local_28 [2];
  
  test_count = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  UnitTest::test_to_run_count((UnitTest *)0x24799e);
  FormatTestCount(test_count);
  pcVar3 = String::c_str(local_28);
  UnitTest::test_case_to_run_count((UnitTest *)0x2479d0);
  FormatTestCaseCount(test_count);
  pcVar4 = String::c_str((String *)(local_58 + 0x10));
  printf("%s from %s ran.",pcVar3,pcVar4);
  String::~String(in_stack_ffffffffffffff20);
  String::~String(in_stack_ffffffffffffff20);
  if ((FLAGS_gtest_print_time & 1) != 0) {
    local_60 = UnitTest::elapsed_time((UnitTest *)0x247a4b);
    in_stack_ffffffffffffff40 = (UnitTest *)local_58;
    StreamableToString<long_long>(in_stack_ffffffffffffff48);
    pcVar3 = String::c_str((String *)in_stack_ffffffffffffff40);
    printf(" (%s ms total)",pcVar3);
    String::~String(in_stack_ffffffffffffff20);
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  UnitTest::successful_test_count((UnitTest *)0x247b45);
  FormatTestCount(test_count);
  pcVar3 = String::c_str(&local_70);
  printf("%s.\n",pcVar3);
  String::~String(in_stack_ffffffffffffff20);
  local_74 = UnitTest::failed_test_count((UnitTest *)0x247b93);
  bVar1 = UnitTest::Passed((UnitTest *)0x247ba4);
  if (!bVar1) {
    local_78 = UnitTest::failed_test_count((UnitTest *)0x247bb9);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    pSVar5 = &local_88;
    FormatTestCount((int)((ulong)pSVar5 >> 0x20));
    pSVar5 = (String *)String::c_str(pSVar5);
    printf("%s, listed below:\n",pSVar5);
    String::~String(pSVar5);
    PrintFailedTests(in_stack_ffffffffffffff40);
    pcVar3 = "TESTS";
    if (local_74 == 1) {
      pcVar3 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)local_74,pcVar3);
  }
  uVar2 = UnitTest::disabled_test_count((UnitTest *)0x247c9b);
  if ((uVar2 != 0) && ((FLAGS_gtest_also_run_disabled_tests & 1) == 0)) {
    if (local_74 == 0) {
      printf("\n");
    }
    pcVar3 = "TESTS";
    if (uVar2 == 1) {
      pcVar3 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar2,pcVar3);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}